

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pcmpgtw_mips64el(uint64_t fs,uint64_t ft)

{
  uint local_2c;
  uint64_t uStack_28;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  uStack_28 = ft;
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    *(uint *)((long)&vt + (ulong)local_2c * 4) =
         -(uint)(*(uint *)((long)&stack0xffffffffffffffd8 + (ulong)local_2c * 4) <
                *(uint *)((long)&vt + (ulong)local_2c * 4));
  }
  return vt.d;
}

Assistant:

uint64_t helper_pcmpgtw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; i++) {
        vs.uw[i] = -(vs.uw[i] > vt.uw[i]);
    }
    return vs.d;
}